

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O3

void on_waitcnt_updated(void)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  uVar1 = (bus->WAITCNT).raw;
  uVar2 = (uint)((uVar1 & 0x10) == 0);
  sequential_byte_half_cycles[8] = uVar2 + 1;
  bVar4 = -1 < (char)uVar1;
  iVar3 = (uint)bVar4 * 3;
  sequential_byte_half_cycles[10] = iVar3 + 1;
  nonsequential_byte_half_cycles[0xe] = 8;
  sequential_byte_half_cycles[0xc] = 1;
  if ((uVar1 >> 10 & 1) == 0) {
    sequential_byte_half_cycles[0xc] = 8;
  }
  switch(uVar1 >> 2 & 3) {
  case 0:
    nonsequential_word_cycles[8] = sequential_byte_half_cycles[8] | 4;
    nonsequential_byte_half_cycles[8] = 4;
    nonsequential_byte_half_cycles[9] = 4;
    nonsequential_byte_half_cycles[10] = 4;
    nonsequential_byte_half_cycles[0xb] = 4;
    nonsequential_word_cycles[10] = iVar3 + 5;
    nonsequential_byte_half_cycles[0xc] = 4;
    nonsequential_byte_half_cycles[0xd] = 4;
    nonsequential_word_cycles[0xc] = sequential_byte_half_cycles[0xc] | 4;
    nonsequential_byte_half_cycles[0xe] = 4;
    break;
  case 1:
    nonsequential_word_cycles[8] = uVar2 + 4;
    nonsequential_byte_half_cycles[8] = 3;
    nonsequential_byte_half_cycles[9] = 3;
    nonsequential_byte_half_cycles[10] = 3;
    nonsequential_byte_half_cycles[0xb] = 3;
    nonsequential_word_cycles[10] = iVar3 + 4;
    nonsequential_byte_half_cycles[0xc] = 3;
    nonsequential_byte_half_cycles[0xd] = 3;
    nonsequential_word_cycles[0xc] = sequential_byte_half_cycles[0xc] + 3;
    nonsequential_byte_half_cycles[0xe] = 3;
    break;
  case 2:
    nonsequential_word_cycles[8] = uVar2 + 3;
    nonsequential_byte_half_cycles[8] = 2;
    nonsequential_byte_half_cycles[9] = 2;
    nonsequential_byte_half_cycles[10] = 2;
    nonsequential_byte_half_cycles[0xb] = 2;
    nonsequential_word_cycles[10] = sequential_byte_half_cycles[10] | 2;
    nonsequential_byte_half_cycles[0xc] = 2;
    nonsequential_byte_half_cycles[0xd] = 2;
    nonsequential_word_cycles[0xc] = sequential_byte_half_cycles[0xc] | 2;
    nonsequential_byte_half_cycles[0xe] = 2;
    break;
  case 3:
    nonsequential_word_cycles[8] = sequential_byte_half_cycles[8] | 8;
    nonsequential_byte_half_cycles[8] = 8;
    nonsequential_byte_half_cycles[9] = 8;
    nonsequential_byte_half_cycles[10] = 8;
    nonsequential_byte_half_cycles[0xb] = 8;
    nonsequential_word_cycles[10] = sequential_byte_half_cycles[10] | 8;
    nonsequential_byte_half_cycles[0xc] = 8;
    nonsequential_byte_half_cycles[0xd] = 8;
    nonsequential_word_cycles[0xc] = sequential_byte_half_cycles[0xc] + 8;
  }
  sequential_word_cycles[0xb] = (uint)bVar4 * 6 + 2;
  sequential_word_cycles[9] = sequential_byte_half_cycles[8] * 2;
  sequential_word_cycles[0xd] = sequential_byte_half_cycles[0xc] * 2;
  nonsequential_byte_half_cycles[0xf] = nonsequential_byte_half_cycles[0xe];
  sequential_byte_half_cycles[0xe] = nonsequential_byte_half_cycles[0xe];
  sequential_byte_half_cycles[0xf] = nonsequential_byte_half_cycles[0xe];
  nonsequential_word_cycles[0xe] = nonsequential_byte_half_cycles[0xe] * 2;
  sequential_word_cycles[0xe] = nonsequential_word_cycles[0xe];
  nonsequential_word_cycles[0xf] = nonsequential_word_cycles[0xe];
  sequential_word_cycles[0xf] = nonsequential_word_cycles[0xe];
  sequential_byte_half_cycles[9] = sequential_byte_half_cycles[8];
  sequential_byte_half_cycles[0xb] = sequential_byte_half_cycles[10];
  sequential_byte_half_cycles[0xd] = sequential_byte_half_cycles[0xc];
  return;
}

Assistant:

void on_waitcnt_updated() {
    nonsequential_byte_half_cycles[REGION_GAMEPAK0_L] = nonsequential_waitstates(bus->WAITCNT.wait_state_0_nonsequential);
    nonsequential_byte_half_cycles[REGION_GAMEPAK0_H] = nonsequential_byte_half_cycles[REGION_GAMEPAK0_L];
    sequential_byte_half_cycles[REGION_GAMEPAK0_L] = bus->WAITCNT.wait_state_0_sequential ? 1 : 2;
    sequential_byte_half_cycles[REGION_GAMEPAK0_H] = bus->WAITCNT.wait_state_0_sequential ? 1 : 2;
    nonsequential_word_cycles[REGION_GAMEPAK0_L] = nonsequential_byte_half_cycles[REGION_GAMEPAK0_L] + sequential_byte_half_cycles[REGION_GAMEPAK0_L];
    sequential_word_cycles[REGION_GAMEPAK0_H] = sequential_byte_half_cycles[REGION_GAMEPAK0_L] * 2;

    nonsequential_byte_half_cycles[REGION_GAMEPAK1_L] = nonsequential_waitstates(bus->WAITCNT.wait_state_1_nonsequential);
    nonsequential_byte_half_cycles[REGION_GAMEPAK1_H] = nonsequential_byte_half_cycles[REGION_GAMEPAK1_L];
    sequential_byte_half_cycles[REGION_GAMEPAK1_L] = bus->WAITCNT.wait_state_1_sequential ? 1 : 4;
    sequential_byte_half_cycles[REGION_GAMEPAK1_H] = bus->WAITCNT.wait_state_1_sequential ? 1 : 4;
    nonsequential_word_cycles[REGION_GAMEPAK1_L] = nonsequential_byte_half_cycles[REGION_GAMEPAK1_L] + sequential_byte_half_cycles[REGION_GAMEPAK1_L];
    sequential_word_cycles[REGION_GAMEPAK1_H] = sequential_byte_half_cycles[REGION_GAMEPAK1_L] * 2;

    nonsequential_byte_half_cycles[REGION_GAMEPAK2_L] = nonsequential_waitstates(bus->WAITCNT.wait_state_2_nonsequential);
    nonsequential_byte_half_cycles[REGION_GAMEPAK2_H] = nonsequential_byte_half_cycles[REGION_GAMEPAK2_L];
    sequential_byte_half_cycles[REGION_GAMEPAK2_L] = bus->WAITCNT.wait_state_2_sequential ? 1 : 8;
    sequential_byte_half_cycles[REGION_GAMEPAK2_H] = bus->WAITCNT.wait_state_2_sequential ? 1 : 8;
    nonsequential_word_cycles[REGION_GAMEPAK2_L] = nonsequential_byte_half_cycles[REGION_GAMEPAK2_L] + sequential_byte_half_cycles[REGION_GAMEPAK2_L];
    sequential_word_cycles[REGION_GAMEPAK2_H] = sequential_byte_half_cycles[REGION_GAMEPAK2_L] * 2;

    nonsequential_byte_half_cycles[REGION_SRAM] = nonsequential_waitstates(bus->WAITCNT.sram_wait);
    nonsequential_byte_half_cycles[REGION_SRAM_MIRR] = nonsequential_byte_half_cycles[REGION_SRAM];
    sequential_byte_half_cycles[REGION_SRAM] = nonsequential_byte_half_cycles[REGION_SRAM];
    sequential_byte_half_cycles[REGION_SRAM_MIRR] = nonsequential_byte_half_cycles[REGION_SRAM];
    nonsequential_word_cycles[REGION_SRAM] = nonsequential_byte_half_cycles[REGION_SRAM] + sequential_byte_half_cycles[REGION_SRAM];
    sequential_word_cycles[REGION_SRAM] = sequential_byte_half_cycles[REGION_SRAM] + sequential_byte_half_cycles[REGION_SRAM];
    nonsequential_word_cycles[REGION_SRAM_MIRR] = nonsequential_word_cycles[REGION_SRAM];
    sequential_word_cycles[REGION_SRAM_MIRR] = sequential_word_cycles[REGION_SRAM];
}